

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O3

void __thiscall
phosg::Image::mask_blit_dst
          (Image *this,Image *source,ssize_t x,ssize_t y,ssize_t w,ssize_t h,ssize_t sx,ssize_t sy,
          uint64_t r,uint64_t g,uint64_t b)

{
  long lVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  uint64_t _a;
  long local_88;
  uint64_t local_80;
  uint64_t local_78;
  uint64_t local_70;
  uint64_t local_68;
  long local_60;
  long local_58;
  ulong local_50;
  long local_48;
  Image *local_40;
  long local_38;
  
  lVar1 = source->width;
  if (w < 0) {
    w = lVar1;
  }
  lVar7 = source->height;
  if (h < 0) {
    h = lVar7;
  }
  uVar4 = sx >> 0x3f & sx;
  local_48 = x - uVar4;
  lVar2 = 0;
  if (sx < 1) {
    sx = lVar2;
  }
  uVar5 = sy >> 0x3f & sy;
  local_58 = y - uVar5;
  if (sy < 1) {
    sy = lVar2;
  }
  lVar3 = 0;
  if (0 < local_48) {
    lVar3 = local_48;
  }
  if (-1 < local_48) {
    local_48 = lVar2;
  }
  uVar4 = uVar4 + w + local_48;
  local_48 = sx - local_48;
  local_60 = 0;
  if (0 < local_58) {
    local_60 = local_58;
  }
  if (-1 < local_58) {
    local_58 = lVar2;
  }
  uVar6 = uVar5 + h + local_58;
  local_58 = sy - local_58;
  uVar5 = lVar1 - local_48;
  if ((long)(uVar4 + local_48) <= lVar1) {
    uVar5 = uVar4;
  }
  uVar4 = lVar7 - local_58;
  if ((long)(uVar6 + local_58) <= lVar7) {
    uVar4 = uVar6;
  }
  uVar6 = this->width - lVar3;
  if ((long)(uVar5 + lVar3) <= this->width) {
    uVar6 = uVar5;
  }
  local_50 = this->height - local_60;
  if ((long)(uVar4 + local_60) <= this->height) {
    local_50 = uVar4;
  }
  if (0 < (long)local_50 && -1 < (long)(local_50 | uVar6)) {
    local_88 = 0;
    local_40 = source;
    do {
      if (0 < (long)uVar6) {
        lVar1 = local_88 + local_60;
        local_38 = local_58 + local_88;
        lVar7 = 0;
        do {
          read_pixel(this,lVar7 + lVar3,lVar1,&local_70,&local_78,&local_80,&local_68);
          if (((local_70 == r) && (local_78 == g)) && (local_80 == b)) {
            read_pixel(local_40,local_48 + lVar7,local_38,&local_70,&local_78,&local_80,&local_68);
            write_pixel(this,lVar7 + lVar3,lVar1,local_70,local_78,local_80,local_68);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 < (long)uVar6);
      }
      local_88 = local_88 + 1;
    } while (local_88 < (long)local_50);
  }
  return;
}

Assistant:

void Image::mask_blit_dst(const Image& source, ssize_t x, ssize_t y, ssize_t w,
    ssize_t h, ssize_t sx, ssize_t sy, uint64_t r, uint64_t g, uint64_t b) {

  if (w < 0) {
    w = source.get_width();
  }
  if (h < 0) {
    h = source.get_height();
  }

  clamp_blit_dimensions(*this, source, &x, &y, &w, &h, &sx, &sy);

  for (int yy = 0; yy < h; yy++) {
    for (int xx = 0; xx < w; xx++) {
      uint64_t _r, _g, _b, _a;
      this->read_pixel(x + xx, y + yy, &_r, &_g, &_b, &_a);
      if (r == _r && g == _g && b == _b) {
        source.read_pixel(sx + xx, sy + yy, &_r, &_g, &_b, &_a);
        this->write_pixel(x + xx, y + yy, _r, _g, _b, _a);
      }
    }
  }
}